

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O0

bool __thiscall road_network::are_twins(road_network *this,node_type n1,node_type n2)

{
  node_type n2_local;
  node_type n1_local;
  road_network *this_local;
  
  switch(n1) {
  case P0:
    this_local._7_1_ = n2 == P4;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case P1:
    this_local._7_1_ = n2 == P5;
    break;
  case P2:
    this_local._7_1_ = n2 == P6;
    break;
  case P3:
    this_local._7_1_ = n2 == P7;
    break;
  case P4:
    this_local._7_1_ = n2 == P0;
    break;
  case P5:
    this_local._7_1_ = n2 == P1;
    break;
  case P6:
    this_local._7_1_ = n2 == P2;
    break;
  case P7:
    this_local._7_1_ = n2 == P3;
  }
  return this_local._7_1_;
}

Assistant:

bool road_network::are_twins(node_type n1, node_type n2)
{
    switch (n1)
    {
        case node_type::P0:
            return n2 == node_type::P4;
        case node_type::P1:
            return n2 == node_type::P5;
        case node_type::P2:
            return n2 == node_type::P6;
        case node_type::P3:
            return n2 == node_type::P7;
        case node_type::P4:
            return n2 == node_type::P0;
        case node_type::P5:
            return n2 == node_type::P1;
        case node_type::P6:
            return n2 == node_type::P2;
        case node_type::P7:
            return n2 == node_type::P3;
        default:
            return false;
    }
}